

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O0

lzma_ret simple_code(lzma_coder_conflict10 *coder,lzma_allocator *allocator,uint8_t *in,
                    size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                    lzma_action action)

{
  lzma_ret lVar1;
  ulong uVar2;
  size_t size_00;
  size_t sVar3;
  lzma_ret ret_1;
  lzma_ret ret;
  size_t out_start;
  size_t unfiltered;
  size_t filtered;
  size_t size;
  size_t buf_avail;
  size_t out_avail;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_coder_conflict10 *coder_local;
  
  if (action == LZMA_SYNC_FLUSH) {
    return LZMA_OPTIONS_ERROR;
  }
  if (coder->pos < coder->filtered) {
    lzma_bufcpy((uint8_t *)(coder + 1),&coder->pos,coder->filtered,out,out_pos,out_size);
    if (coder->pos < coder->filtered) {
      return LZMA_OK;
    }
    if ((coder->end_was_reached & 1U) != 0) {
      if (coder->filtered == coder->size) {
        return LZMA_STREAM_END;
      }
      __assert_fail("coder->filtered == coder->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0x60,
                    "lzma_ret simple_code(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
  }
  coder->filtered = 0;
  if ((coder->end_was_reached & 1U) != 0) {
    __assert_fail("!coder->end_was_reached",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                  ,0x68,
                  "lzma_ret simple_code(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  uVar2 = coder->size - coder->pos;
  if ((uVar2 < out_size - *out_pos) || (uVar2 == 0)) {
    sVar3 = *out_pos;
    memcpy(out + *out_pos,(void *)((long)&coder[1].next.coder + coder->pos),uVar2);
    *out_pos = uVar2 + *out_pos;
    lVar1 = copy_or_code(coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    if (lVar1 == LZMA_STREAM_END) {
      __assert_fail("ret != LZMA_STREAM_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0x86,
                    "lzma_ret simple_code(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    if (lVar1 != LZMA_OK) {
      return lVar1;
    }
    size_00 = *out_pos - sVar3;
    sVar3 = call_filter(coder,out + sVar3,size_00);
    uVar2 = size_00 - sVar3;
    if (coder->allocated >> 1 < uVar2) {
      __assert_fail("unfiltered <= coder->allocated / 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0x90,
                    "lzma_ret simple_code(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    coder->pos = 0;
    coder->size = uVar2;
    if ((coder->end_was_reached & 1U) == 0) {
      if (uVar2 != 0) {
        *out_pos = *out_pos - uVar2;
        memcpy(coder + 1,out + *out_pos,uVar2);
      }
    }
    else {
      coder->size = 0;
    }
  }
  else if (coder->pos != 0) {
    memmove(coder + 1,(void *)((long)&coder[1].next.coder + coder->pos),uVar2);
    coder->size = coder->size - coder->pos;
    coder->pos = 0;
  }
  if (coder->pos != 0) {
    __assert_fail("coder->pos == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                  ,0xa8,
                  "lzma_ret simple_code(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  if (coder->size != 0) {
    lVar1 = copy_or_code(coder,allocator,in,in_pos,in_size,(uint8_t *)(coder + 1),&coder->size,
                         coder->allocated,action);
    if (lVar1 == LZMA_STREAM_END) {
      __assert_fail("ret != LZMA_STREAM_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/simple/simple_coder.c"
                    ,0xb4,
                    "lzma_ret simple_code(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    if (lVar1 != LZMA_OK) {
      return lVar1;
    }
    sVar3 = call_filter(coder,(uint8_t *)(coder + 1),coder->size);
    coder->filtered = sVar3;
    if ((coder->end_was_reached & 1U) != 0) {
      coder->filtered = coder->size;
    }
    lzma_bufcpy((uint8_t *)(coder + 1),&coder->pos,coder->filtered,out,out_pos,out_size);
  }
  if (((coder->end_was_reached & 1U) == 0) || (coder->pos != coder->size)) {
    coder_local._4_4_ = LZMA_OK;
  }
  else {
    coder_local._4_4_ = LZMA_STREAM_END;
  }
  return coder_local._4_4_;
}

Assistant:

static lzma_ret
simple_code(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	size_t out_avail;
	size_t buf_avail;

	// TODO: Add partial support for LZMA_SYNC_FLUSH. We can support it
	// in cases when the filter is able to filter everything. With most
	// simple filters it can be done at offset that is a multiple of 2,
	// 4, or 16. With x86 filter, it needs good luck, and thus cannot
	// be made to work predictably.
	if (action == LZMA_SYNC_FLUSH)
		return LZMA_OPTIONS_ERROR;

	// Flush already filtered data from coder->buffer[] to out[].
	if (coder->pos < coder->filtered) {
		lzma_bufcpy(coder->buffer, &coder->pos, coder->filtered,
				out, out_pos, out_size);

		// If we couldn't flush all the filtered data, return to
		// application immediately.
		if (coder->pos < coder->filtered)
			return LZMA_OK;

		if (coder->end_was_reached) {
			assert(coder->filtered == coder->size);
			return LZMA_STREAM_END;
		}
	}

	// If we get here, there is no filtered data left in the buffer.
	coder->filtered = 0;

	assert(!coder->end_was_reached);

	// If there is more output space left than there is unfiltered data
	// in coder->buffer[], flush coder->buffer[] to out[], and copy/code
	// more data to out[] hopefully filling it completely. Then filter
	// the data in out[]. This step is where most of the data gets
	// filtered if the buffer sizes used by the application are reasonable.
	out_avail = out_size - *out_pos;
	buf_avail = coder->size - coder->pos;
	if (out_avail > buf_avail || buf_avail == 0) {
		size_t size;
		size_t filtered;
		size_t unfiltered;

		// Store the old position so that we know from which byte
		// to start filtering.
		const size_t out_start = *out_pos;

		// Flush data from coder->buffer[] to out[], but don't reset
		// coder->pos and coder->size yet. This way the coder can be
		// restarted if the next filter in the chain returns e.g.
		// LZMA_MEM_ERROR.
		memcpy(out + *out_pos, coder->buffer + coder->pos, buf_avail);
		*out_pos += buf_avail;

		// Copy/Encode/Decode more data to out[].
		{
			const lzma_ret ret = copy_or_code(coder, allocator,
					in, in_pos, in_size,
					out, out_pos, out_size, action);
			assert(ret != LZMA_STREAM_END);
			if (ret != LZMA_OK)
				return ret;
		}

		// Filter out[].
		size = *out_pos - out_start;
		filtered = call_filter(coder, out + out_start, size);

		unfiltered = size - filtered;
		assert(unfiltered <= coder->allocated / 2);

		// Now we can update coder->pos and coder->size, because
		// the next coder in the chain (if any) was successful.
		coder->pos = 0;
		coder->size = unfiltered;

		if (coder->end_was_reached) {
			// The last byte has been copied to out[] already.
			// They are left as is.
			coder->size = 0;

		} else if (unfiltered > 0) {
			// There is unfiltered data left in out[]. Copy it to
			// coder->buffer[] and rewind *out_pos appropriately.
			*out_pos -= unfiltered;
			memcpy(coder->buffer, out + *out_pos, unfiltered);
		}
	} else if (coder->pos > 0) {
		memmove(coder->buffer, coder->buffer + coder->pos, buf_avail);
		coder->size -= coder->pos;
		coder->pos = 0;
	}

	assert(coder->pos == 0);

	// If coder->buffer[] isn't empty, try to fill it by copying/decoding
	// more data. Then filter coder->buffer[] and copy the successfully
	// filtered data to out[]. It is probable, that some filtered and
	// unfiltered data will be left to coder->buffer[].
	if (coder->size > 0) {
		{
			const lzma_ret ret = copy_or_code(coder, allocator,
					in, in_pos, in_size,
					coder->buffer, &coder->size,
					coder->allocated, action);
			assert(ret != LZMA_STREAM_END);
			if (ret != LZMA_OK)
				return ret;
		}

		coder->filtered = call_filter(
				coder, coder->buffer, coder->size);

		// Everything is considered to be filtered if coder->buffer[]
		// contains the last bytes of the data.
		if (coder->end_was_reached)
			coder->filtered = coder->size;

		// Flush as much as possible.
		lzma_bufcpy(coder->buffer, &coder->pos, coder->filtered,
				out, out_pos, out_size);
	}

	// Check if we got everything done.
	if (coder->end_was_reached && coder->pos == coder->size)
		return LZMA_STREAM_END;

	return LZMA_OK;
}